

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O3

void wostringstream_suite::test_single(void)

{
  int iVar1;
  wostringstream output;
  wchar_t local_1a4;
  undefined8 local_1a0 [2];
  long local_190 [2];
  long local_180 [4];
  int aiStack_160 [20];
  ios_base local_110 [264];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_180);
  local_1a0[0]._0_1_ = *(int *)((long)aiStack_160 + *(long *)(local_180[0] + -0x18)) == 0;
  local_1a4 = CONCAT31(local_1a4._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(1)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x6e,"void wostringstream_suite::test_single()",local_1a0,&local_1a4);
  local_1a4 = L'A';
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)local_180,&local_1a4,1);
  std::__cxx11::wstringbuf::str();
  iVar1 = std::__cxx11::wstring::compare((wchar_t *)local_1a0);
  boost::detail::test_impl
            ("output.str() == L\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x70,"void wostringstream_suite::test_single()",iVar1 == 0);
  if ((long *)CONCAT71(local_1a0[0]._1_7_,(undefined1)local_1a0[0]) != local_190) {
    operator_delete((long *)CONCAT71(local_1a0[0]._1_7_,(undefined1)local_1a0[0]),
                    local_190[0] * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_single()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(1), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(L'A'));
    TRIAL_PROTOCOL_TEST(output.str() == L"A");
}